

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty.c++
# Opt level: O2

void __thiscall capnp::TwoPartyVatNetwork::setIdle(TwoPartyVatNetwork *this,bool idle)

{
  Fault f;
  DebugComparison<bool_&,_bool_&> _kjCondition;
  bool local_39;
  Fault local_38;
  DebugComparison<bool_&,_bool_&> local_30;
  
  local_30.left = &local_39;
  local_30.right = &this->idle;
  local_30.result = this->idle != idle;
  local_30.op.content.ptr = anon_var_dwarf_43885;
  local_30.op.content.size_ = 5;
  if (local_30.result) {
    *local_30.right = idle;
    return;
  }
  local_39 = idle;
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<bool&,bool&>&>
            (&local_38,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-twoparty.c++"
             ,0x158,FAILED,"idle != this->idle","_kjCondition,",&local_30);
  kj::_::Debug::Fault::fatal(&local_38);
}

Assistant:

void TwoPartyVatNetwork::setIdle(bool idle) {
  // TwoPartyVatNetwork doesn't care about idleness, but tracks it just for the sake of catching
  // bugs in the RPC system itself.
  KJ_REQUIRE(idle != this->idle);
  this->idle = idle;
}